

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O2

void __thiscall
google::protobuf::MethodDescriptorProto::set_input_type(MethodDescriptorProto *this,char *value)

{
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (value == (char *)0x0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
               ,0x185e);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: value != NULL: ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
  std::__cxx11::string::string((string *)&local_50,value,(allocator *)&local_51);
  internal::ArenaStringPtr::SetNoArena
            (&this->input_type_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
             (string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

inline void MethodDescriptorProto::set_input_type(const char* value) {
  GOOGLE_DCHECK(value != NULL);
  set_has_input_type();
  input_type_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), ::std::string(value));
  // @@protoc_insertion_point(field_set_char:google.protobuf.MethodDescriptorProto.input_type)
}